

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

bool pztopology::TPZTriangle::IsInParametricDomain(TPZVec<double> *pt,REAL tol)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  
  dVar1 = *pt->fStore;
  if ((((tol + 1.0 < dVar1) || (dVar1 < 0.0 - tol)) || (dVar2 = pt->fStore[1], tol + 1.0 < dVar2))
     || ((dVar2 < 0.0 - tol || (bVar3 = true, (1.0 - dVar1) + tol < dVar2)))) {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

T& operator[]( const int64_t index ) const
	{
#ifdef PZDEBUG
		if( index < 0 || index >= fNElements )
		{
            PZError << __PRETTY_FUNCTION__ << " acessing element out of range.";
            PZError << "|" << std::endl;
            PZError << "+-> NElements = " << NElements() << std::endl;
            PZError << "|" << std::endl;
            PZError << "+-> Index = " << index << std::endl;
            DebugStop();
            exit( -1 );
		}
#endif
		return fStore[ index ];
	}